

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cpp
# Opt level: O1

uint64_t __thiscall r_exec::_Mem::start(_Mem *this)

{
  multiset<core::P<r_exec::View>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
  *this_00;
  vector<std::thread,_std::allocator<std::thread>_> *pvVar1;
  Group *this_01;
  _Hash_node_base *p_Var2;
  View *pVVar3;
  iterator iVar4;
  bool bVar5;
  uint32_t uVar6;
  ulong now;
  ModelBase *pMVar7;
  TimeJob *pTVar8;
  uint64_t uVar9;
  UpdateJob *this_02;
  pointer ppGVar10;
  PerfSamplingJob *this_03;
  pointer ppGVar11;
  _Hash_node_base *p_Var12;
  ulong uVar13;
  key_type *__k;
  pair<r_exec::View_*,_r_exec::Group_*> *initial_reduction_job;
  pair<r_exec::View_*,_r_exec::Group_*> *ppVar14;
  float fVar15;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar16;
  uint8_t selector_1;
  const_iterator end;
  const_iterator v;
  uint8_t selector;
  vector<std::pair<r_exec::View_*,_r_exec::Group_*>,_std::allocator<std::pair<r_exec::View_*,_r_exec::Group_*>_>_>
  initial_reduction_jobs;
  uint8_t local_a1;
  _Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false> local_a0;
  _Mem *local_98;
  pair<r_exec::View_*,_r_exec::Group_*> local_90;
  float local_7c;
  _Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false> local_78;
  JobQueue<r_exec::TimeJob> *local_70;
  float local_64;
  float local_60;
  float local_5c;
  pair<r_exec::View_*,_r_exec::Group_*> *local_58;
  iterator iStack_50;
  pair<r_exec::View_*,_r_exec::Group_*> *local_48;
  ulong local_38;
  
  if ((this->state & ~STOPPED) == NOT_STARTED) {
    LOCK();
    (this->m_coreCount).super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    local_58 = (pair<r_exec::View_*,_r_exec::Group_*> *)0x0;
    iStack_50._M_current = (pair<r_exec::View_*,_r_exec::Group_*> *)0x0;
    local_48 = (pair<r_exec::View_*,_r_exec::Group_*> *)0x0;
    now = (*Now)();
    r_code::Utils::SetTimeReference(now);
    pMVar7 = ModelBase::Get();
    pMVar7->thz = this->secondary_thz;
    init_timings(this,now);
    ppGVar10 = (this->initial_groups).
               super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppGVar11 = (this->initial_groups).
               super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    local_98 = this;
    if (ppGVar11 != ppGVar10) {
      local_70 = &this->m_timeJobQueue;
      uVar13 = 0;
      do {
        this_01 = ppGVar10[uVar13];
        local_7c = Group::get_c_act(this_01);
        local_5c = Group::get_c_act_thr(this_01);
        local_60 = Group::get_c_sln(this_01);
        local_64 = Group::get_c_sln_thr(this_01);
        local_90.first = (View *)(this_01->ipgm_views)._M_h._M_before_begin._M_nxt;
        local_a0._M_cur = (__node_type *)0x0;
        local_78._M_cur = local_78._M_cur & 0xffffffffffffff00;
        while (bVar5 = Group::all_views_cond
                                 (this_01,(uint8_t *)&local_78,(const_iterator *)&local_90,
                                  (const_iterator *)&local_a0), bVar5) {
          r_code::Utils::SetIndirectTimestamp<r_exec::View>
                    ((View *)((local_90.first)->super_View).references[0],2,now);
          local_90.first = (View *)((local_90.first)->super_View).super__Object._vptr__Object;
        }
        local_38 = uVar13;
        if (local_5c < local_7c) {
          for (p_Var12 = (this_01->input_less_ipgm_views)._M_h._M_before_begin._M_nxt;
              p_Var12 != (_Hash_node_base *)0x0; p_Var12 = p_Var12->_M_nxt) {
            p_Var2 = p_Var12[2]._M_nxt[0x16]._M_nxt;
            if ((p_Var2 != (_Hash_node_base *)0x0) && (p_Var2[3]._M_nxt == (_Hash_node_base *)0x1))
            {
              pTVar8 = (TimeJob *)operator_new(0x28);
              pVVar3 = (View *)p_Var12[2]._M_nxt;
              uVar9 = r_code::Utils::GetTimestamp<r_code::Code>
                                ((Code *)(pVVar3->super_View).object.object,4);
              InputLessPGMSignalingJob::InputLessPGMSignalingJob
                        ((InputLessPGMSignalingJob *)pTVar8,pVVar3,uVar9 + now);
              this = local_98;
              if (local_98->state == STOPPED) {
                (*(pTVar8->super__Object)._vptr__Object[1])(pTVar8);
              }
              else {
                JobQueue<r_exec::TimeJob>::pushJob(local_70,pTVar8);
              }
            }
          }
          for (p_Var12 = (this_01->anti_ipgm_views)._M_h._M_before_begin._M_nxt;
              p_Var12 != (_Hash_node_base *)0x0; p_Var12 = p_Var12->_M_nxt) {
            p_Var2 = p_Var12[2]._M_nxt[0x16]._M_nxt;
            if ((p_Var2 != (_Hash_node_base *)0x0) && (p_Var2[3]._M_nxt == (_Hash_node_base *)0x1))
            {
              pTVar8 = (TimeJob *)operator_new(0x28);
              pVVar3 = (View *)p_Var12[2]._M_nxt;
              uVar9 = r_code::Utils::GetTimestamp<r_code::Code>
                                ((Code *)(pVVar3->super_View).object.object,4);
              AntiPGMSignalingJob::AntiPGMSignalingJob
                        ((AntiPGMSignalingJob *)pTVar8,pVVar3,uVar9 + now);
              this = local_98;
              if (local_98->state == STOPPED) {
                (*(pTVar8->super__Object)._vptr__Object[1])(pTVar8);
              }
              else {
                JobQueue<r_exec::TimeJob>::pushJob(local_70,pTVar8);
              }
            }
          }
        }
        uVar13 = local_38;
        if (local_64 < local_60) {
          local_a0._M_cur = (__node_type *)(this_01->ipgm_views)._M_h._M_before_begin._M_nxt;
          local_78._M_cur = (__node_type *)0x0;
          local_a1 = '\0';
          bVar5 = Group::all_views_cond
                            (this_01,&local_a1,(const_iterator *)&local_a0,
                             (const_iterator *)&local_78);
          this = local_98;
          if (bVar5) {
            this_00 = &this_01->newly_salient_views;
            do {
              local_7c = r_exec::View::get_sln
                                   (*(View **)((long)&((local_a0._M_cur)->
                                                                                                            
                                                  super__Hash_node_value<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>
                                                  ._M_storage._M_storage + 8));
              fVar15 = Group::get_sln_thr(this_01);
              if (fVar15 < local_7c) {
                __k = (key_type *)
                      ((long)&((local_a0._M_cur)->
                              super__Hash_node_value<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                              ).
                              super__Hash_node_value_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>
                              ._M_storage._M_storage + 8);
                pVar16 = std::
                         _Rb_tree<core::P<r_exec::View>,_core::P<r_exec::View>,_std::_Identity<core::P<r_exec::View>_>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
                         ::_M_get_insert_equal_pos(&this_00->_M_t,__k);
                local_90.first = (View *)this_00;
                std::
                _Rb_tree<core::P<r_exec::View>,core::P<r_exec::View>,std::_Identity<core::P<r_exec::View>>,r_code::View::Less,std::allocator<core::P<r_exec::View>>>
                ::
                _M_insert_<core::P<r_exec::View>const&,std::_Rb_tree<core::P<r_exec::View>,core::P<r_exec::View>,std::_Identity<core::P<r_exec::View>>,r_code::View::Less,std::allocator<core::P<r_exec::View>>>::_Alloc_node>
                          ((_Rb_tree<core::P<r_exec::View>,core::P<r_exec::View>,std::_Identity<core::P<r_exec::View>>,r_code::View::Less,std::allocator<core::P<r_exec::View>>>
                            *)this_00,pVar16.first,pVar16.second,__k,(_Alloc_node *)&local_90);
                local_90.first =
                     *(View **)((long)&((local_a0._M_cur)->
                                       super__Hash_node_value<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                                       ).
                                       super__Hash_node_value_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>
                                       ._M_storage._M_storage + 8);
                local_90.second = this_01;
                if (iStack_50._M_current == local_48) {
                  std::
                  vector<std::pair<r_exec::View*,r_exec::Group*>,std::allocator<std::pair<r_exec::View*,r_exec::Group*>>>
                  ::_M_realloc_insert<std::pair<r_exec::View*,r_exec::Group*>>
                            ((vector<std::pair<r_exec::View*,r_exec::Group*>,std::allocator<std::pair<r_exec::View*,r_exec::Group*>>>
                              *)&local_58,iStack_50,&local_90);
                }
                else {
                  (iStack_50._M_current)->first = local_90.first;
                  (iStack_50._M_current)->second = this_01;
                  iStack_50._M_current = iStack_50._M_current + 1;
                }
              }
              local_a0._M_cur = (__node_type *)((local_a0._M_cur)->super__Hash_node_base)._M_nxt;
              bVar5 = Group::all_views_cond
                                (this_01,&local_a1,(const_iterator *)&local_a0,
                                 (const_iterator *)&local_78);
              this = local_98;
            } while (bVar5);
          }
        }
        uVar6 = Group::get_upr(this_01);
        if (uVar6 != 0) {
          this_02 = (UpdateJob *)operator_new(0x28);
          uVar9 = Group::get_next_upr_time(this_01,now);
          UpdateJob::UpdateJob(this_02,this_01,uVar9);
          if (this->state == STOPPED) {
            (*(this_02->super_TimeJob).super__Object._vptr__Object[1])(this_02);
          }
          else {
            JobQueue<r_exec::TimeJob>::pushJob(local_70,(TimeJob *)this_02);
          }
        }
        uVar13 = uVar13 + 1;
        ppGVar10 = (this->initial_groups).
                   super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppGVar11 = (this->initial_groups).
                   super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      } while (uVar13 < (ulong)((long)ppGVar11 - (long)ppGVar10 >> 3));
    }
    if (ppGVar11 != ppGVar10) {
      (this->initial_groups).super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppGVar10;
    }
    this->state = RUNNING;
    this_03 = (PerfSamplingJob *)operator_new(0x28);
    PerfSamplingJob::PerfSamplingJob
              (this_03,now + this->perf_sampling_period,this->perf_sampling_period);
    if (this->state == STOPPED) {
      (*(this_03->super_TimeJob).super__Object._vptr__Object[1])(this_03);
    }
    else {
      JobQueue<r_exec::TimeJob>::pushJob(&this->m_timeJobQueue,(TimeJob *)this_03);
    }
    if (this->reduction_core_count != 0) {
      pvVar1 = &local_98->m_coreThreads;
      uVar13 = 0;
      do {
        local_a0._M_cur = (__node_type *)runReductionCore;
        std::thread::thread<void(*)(),,void>((thread *)&local_90,(_func_void **)&local_a0);
        std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                  (pvVar1,(thread *)&local_90);
        if (local_90.first != (View *)0x0) goto LAB_001883d3;
        uVar13 = uVar13 + 1;
      } while (uVar13 < local_98->reduction_core_count);
    }
    ppVar14 = local_58;
    iVar4._M_current = iStack_50._M_current;
    if (local_98->time_core_count != 0) {
      pvVar1 = &local_98->m_coreThreads;
      uVar13 = 0;
      do {
        local_a0._M_cur = (__node_type *)runTimeCore;
        std::thread::thread<void(*)(),,void>((thread *)&local_90,(_func_void **)&local_a0);
        std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                  (pvVar1,(thread *)&local_90);
        if (local_90.first != (View *)0x0) {
LAB_001883d3:
          std::terminate();
        }
        uVar13 = uVar13 + 1;
        ppVar14 = local_58;
        iVar4._M_current = iStack_50._M_current;
      } while (uVar13 < local_98->time_core_count);
    }
    for (; ppVar14 != iVar4._M_current; ppVar14 = ppVar14 + 1) {
      Group::inject_reduction_jobs(ppVar14->second,ppVar14->first);
    }
    if (local_58 != (pair<r_exec::View_*,_r_exec::Group_*> *)0x0) {
      operator_delete(local_58);
    }
  }
  else {
    now = 0;
  }
  return now;
}

Assistant:

uint64_t _Mem::start()
{
    if (state != STOPPED && state != NOT_STARTED) {
        return 0;
    }

    m_coreCount = 0;
    std::vector<std::pair<View *, Group *> > initial_reduction_jobs;
    uint64_t i;
    uint64_t now = Now();
    Utils::SetTimeReference(now);
    ModelBase::Get()->set_thz(secondary_thz);
    init_timings(now);

    for (i = 0; i < initial_groups.size(); ++i) {
        Group *g = initial_groups[i];
        bool c_active = g->get_c_act() > g->get_c_act_thr();
        bool c_salient = g->get_c_sln() > g->get_c_sln_thr();
        FOR_ALL_VIEWS_BEGIN(g, v)
        Utils::SetIndirectTimestamp<View>(v->second, VIEW_IJT, now); // init injection time for the view.
        FOR_ALL_VIEWS_END

        if (c_active) {
            std::unordered_map<uint64_t, P<View> >::const_iterator v;

            // build signaling jobs for active input-less overlays.
            for (v = g->input_less_ipgm_views.begin(); v != g->input_less_ipgm_views.end(); ++v) {
                if (v->second->controller != nullptr && v->second->controller->is_activated()) {
                    pushTimeJob(new InputLessPGMSignalingJob(v->second, now + Utils::GetTimestamp<Code>(v->second->object, IPGM_TSC)));
                }
            }

            // build signaling jobs for active anti-pgm overlays.
            for (v = g->anti_ipgm_views.begin(); v != g->anti_ipgm_views.end(); ++v) {
                if (v->second->controller != nullptr && v->second->controller->is_activated()) {
                    pushTimeJob(new AntiPGMSignalingJob(v->second, now + Utils::GetTimestamp<Code>(v->second->object, IPGM_TSC)));
                }
            }
        }

        if (c_salient) {
            // build reduction jobs for each salient view and each active overlay - regardless of the view's sync mode.
            FOR_ALL_VIEWS_BEGIN(g, v)

            if (v->second->get_sln() > g->get_sln_thr()) { // salient view.
                g->newly_salient_views.insert(v->second);
                initial_reduction_jobs.push_back(std::pair<View *, Group *>(v->second, g));
            }

            FOR_ALL_VIEWS_END
        }

        if (g->get_upr() > 0) { // inject the next update job for the group.
            pushTimeJob(new UpdateJob(g, g->get_next_upr_time(now)));
        }
    }

    initial_groups.clear();
    state = RUNNING;
    pushTimeJob(new PerfSamplingJob(now + perf_sampling_period, perf_sampling_period));

    for (i = 0; i < reduction_core_count; ++i) {
        m_coreThreads.push_back(std::thread(&r_exec::runReductionCore));
    }

    for (i = 0; i < time_core_count; ++i) {
        m_coreThreads.push_back(std::thread(&r_exec::runTimeCore));
    }

    for (auto & initial_reduction_job : initial_reduction_jobs) {
        initial_reduction_job.second->inject_reduction_jobs(initial_reduction_job.first);
    }

    return now;
}